

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::
     __sort_heap<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
               (iterator __first,iterator __last,
               _Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)> *__comp)

{
  QGraphicsObject *__value;
  long lVar1;
  QGraphicsObject **ppQVar2;
  
  lVar1 = (long)__last.i - (long)__first.i;
  if (8 < lVar1) {
    ppQVar2 = __last.i + -1;
    do {
      __value = *ppQVar2;
      *ppQVar2 = *__first.i;
      lVar1 = lVar1 + -8;
      __adjust_heap<QList<QGraphicsObject*>::iterator,long_long,QGraphicsObject*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (__first,0,lVar1 >> 3,__value,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                 __comp->_M_comp);
      ppQVar2 = ppQVar2 + -1;
    } while (8 < lVar1);
  }
  return;
}

Assistant:

inline qsizetype operator-(iterator j) const { return i - j.i; }